

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenConstSetValueV128(BinaryenExpressionRef expr,uint8_t *value)

{
  Literal local_30;
  
  if (expr->_id != ConstId) {
    __assert_fail("expression->is<Const>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xb18,"void BinaryenConstSetValueV128(BinaryenExpressionRef, const uint8_t *)");
  }
  if (value != (uint8_t *)0x0) {
    wasm::Literal::Literal(&local_30,value);
    wasm::Literal::operator=((Literal *)(expr + 1),&local_30);
    wasm::Literal::~Literal(&local_30);
    return;
  }
  __assert_fail("value",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xb19,"void BinaryenConstSetValueV128(BinaryenExpressionRef, const uint8_t *)");
}

Assistant:

void BinaryenConstSetValueV128(BinaryenExpressionRef expr,
                               const uint8_t value[16]) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Const>());
  assert(value); // nullptr would be wrong
  static_cast<Const*>(expression)->value = Literal(value);
}